

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Reset(ByteCodeWriter *this)

{
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  Type pSVar3;
  CallRegToLdFldCacheIndexMap *pCVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type pSVar8;
  
  this->isInUse = false;
  if (this->isInitialized == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x10d,"(isInitialized)","isInitialized");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  Data::Reset(&this->m_byteCodeData);
  Data::Reset(&this->m_auxiliaryData);
  Data::Reset(&this->m_auxContextData);
  this->lastOpcode = FunctionEntry;
  UpdateNextBranchIslandOffset(this,0,0);
  (this->m_longJumpOffsets->
  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).count =
       0;
  pLVar1 = this->m_labelOffsets;
  (pLVar1->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this->m_jumpOffsets->
  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).count =
       0;
  (this->m_loopHeaders->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  pAVar2 = &((pLVar1->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
            alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pSVar8 = (this->rootObjectLoadInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next
  ;
  while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar8 !=
         &this->rootObjectLoadInlineCacheOffsets) {
    pSVar3 = pSVar8->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar2,pSVar8,0x10);
    pSVar8 = pSVar3;
  }
  (this->rootObjectLoadInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->rootObjectLoadInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectLoadInlineCacheOffsets).super_RealCount.count = 0;
  pAVar2 = &((this->m_labelOffsets->
             super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pSVar8 = (this->rootObjectStoreInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.
           next;
  while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar8 !=
         &this->rootObjectStoreInlineCacheOffsets) {
    pSVar3 = pSVar8->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar2,pSVar8,0x10);
    pSVar8 = pSVar3;
  }
  (this->rootObjectStoreInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->rootObjectStoreInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectStoreInlineCacheOffsets).super_RealCount.count = 0;
  pAVar2 = &((this->m_labelOffsets->
             super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pSVar8 = (this->rootObjectLoadMethodInlineCacheOffsets).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar8 !=
         &this->rootObjectLoadMethodInlineCacheOffsets) {
    pSVar3 = pSVar8->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar2,pSVar8,0x10);
    pSVar8 = pSVar3;
  }
  (this->rootObjectLoadMethodInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->rootObjectLoadMethodInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectLoadMethodInlineCacheOffsets).super_RealCount.count = 0;
  pCVar4 = this->callRegToLdFldCacheIndexMap;
  pCVar4->size = 0;
  pCVar4->bucketCount = 0;
  pCVar4->count = 0;
  pCVar4->freeCount = 0;
  pCVar4->modFunctionIndex = 0x4b;
  pCVar4->buckets = (Type)0x0;
  pCVar4->entries = (Type)0x0;
  this->m_pMatchingNode = (ParseNode *)0x0;
  this->m_matchingNodeRefCount = 0;
  this->m_functionWrite = (FunctionBody *)0x0;
  this->m_currentDebuggerScope = (DebuggerScope *)0x0;
  this->m_loopNest = 0;
  this->m_byteCodeCount = 0;
  this->m_byteCodeWithoutLDACount = 0;
  this->m_byteCodeInLoopCount = 0;
  return;
}

Assistant:

void ByteCodeWriter::Reset()
    {
        DebugOnly(isInUse = false);
        Assert(isInitialized);
        m_byteCodeData.Reset();
        m_auxiliaryData.Reset();
        m_auxContextData.Reset();
#ifdef BYTECODE_BRANCH_ISLAND
        lastOpcode = Js::OpCode::FunctionEntry;
        this->UpdateNextBranchIslandOffset(0, 0);
        m_longJumpOffsets->Clear();
#endif
        m_labelOffsets->Clear();
        m_jumpOffsets->Clear();
        m_loopHeaders->Clear();
        rootObjectLoadInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectStoreInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectLoadMethodInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        callRegToLdFldCacheIndexMap->ResetNoDelete();
        m_pMatchingNode = nullptr;
        m_matchingNodeRefCount = 0;
        m_functionWrite = nullptr;
        m_byteCodeCount = 0;
        m_byteCodeWithoutLDACount = 0;
        m_byteCodeInLoopCount = 0;
        m_loopNest = 0;
        m_currentDebuggerScope = nullptr;
    }